

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O2

void __thiscall cfdcore_manager_Finalize_Test::TestBody(cfdcore_manager_Finalize_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Finalize((CfdCoreHandle)0x0,false);
    }
  }
  else {
    testing::Message::Message((Message *)&local_10);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_manager.cpp"
               ,0x31,
               "Expected: (Finalize(handle)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&AStack_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_10);
  }
  return;
}

Assistant:

TEST(cfdcore_manager, Finalize) {
  // error only
  CfdCoreHandle handle = nullptr;
  EXPECT_NO_THROW((Finalize(handle)));
}